

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                   string *validation_name,string *item_name,
                   vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                   *objects_info,XrFacialBlendShapeML value)

{
  bool bVar1;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_b8;
  allocator local_99;
  string local_98 [8];
  string error_str;
  allocator local_61;
  string local_60 [8];
  string vuid;
  XrFacialBlendShapeML value_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *objects_info_local;
  string *item_name_local;
  string *validation_name_local;
  string *command_name_local;
  GenValidUsageXrInstanceInfo *instance_info_local;
  
  if ((instance_info == (GenValidUsageXrInstanceInfo *)0x0) ||
     (bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,"XR_ML_facial_expression"), bVar1)
     ) {
    switch(value) {
    case XR_FACIAL_BLEND_SHAPE_BROW_LOWERER_L_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_BROW_LOWERER_R_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_CHEEK_RAISER_L_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_CHEEK_RAISER_R_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_CHIN_RAISER_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_DIMPLER_L_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_DIMPLER_R_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_EYES_CLOSED_L_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_EYES_CLOSED_R_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_INNER_BROW_RAISER_L_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_INNER_BROW_RAISER_R_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_JAW_DROP_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_LID_TIGHTENER_L_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_LID_TIGHTENER_R_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_LIP_CORNER_DEPRESSOR_L_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_LIP_CORNER_DEPRESSOR_R_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_LIP_CORNER_PULLER_L_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_LIP_CORNER_PULLER_R_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_LIP_FUNNELER_LB_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_LIP_FUNNELER_LT_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_LIP_FUNNELER_RB_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_LIP_FUNNELER_RT_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_LIP_PRESSOR_L_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_LIP_PRESSOR_R_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_LIP_PUCKER_L_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_LIP_PUCKER_R_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_LIP_STRETCHER_L_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_LIP_STRETCHER_R_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_LIP_SUCK_LB_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_LIP_SUCK_LT_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_LIP_SUCK_RB_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_LIP_SUCK_RT_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_LIP_TIGHTENER_L_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_LIP_TIGHTENER_R_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_LIPS_TOWARD_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_LOWER_LIP_DEPRESSOR_L_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_LOWER_LIP_DEPRESSOR_R_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_NOSE_WRINKLER_L_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_NOSE_WRINKLER_R_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_OUTER_BROW_RAISER_L_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_OUTER_BROW_RAISER_R_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_UPPER_LID_RAISER_L_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_UPPER_LID_RAISER_R_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_UPPER_LIP_RAISER_L_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_UPPER_LIP_RAISER_R_ML:
      instance_info_local._7_1_ = true;
      break;
    case XR_FACIAL_BLEND_SHAPE_TONGUE_OUT_ML:
      instance_info_local._7_1_ = true;
      break;
    default:
      instance_info_local._7_1_ = false;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"VUID-",&local_61);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    std::__cxx11::string::operator+=(local_60,(string *)validation_name);
    std::__cxx11::string::operator+=(local_60,"-");
    std::__cxx11::string::operator+=(local_60,(string *)item_name);
    std::__cxx11::string::operator+=(local_60,"-parameter");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"XrFacialBlendShapeML requires extension ",&local_99);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    std::__cxx11::string::operator+=
              (local_98," \"XR_ML_facial_expression\" to be enabled, but it is not enabled");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_b8,objects_info);
    CoreValidLogMessage(instance_info,(string *)local_60,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                        command_name,&local_b8,(string *)local_98);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
              (&local_b8);
    instance_info_local._7_1_ = false;
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_60);
  }
  return instance_info_local._7_1_;
}

Assistant:

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,
                    const std::string &command_name,
                    const std::string &validation_name,
                    const std::string &item_name,
                    std::vector<GenValidUsageXrObjectInfo>& objects_info,
                    const XrFacialBlendShapeML value) {
    (void)instance_info;  // quiet warnings
    (void)command_name;  // quiet warnings
    (void)validation_name;  // quiet warnings
    (void)item_name;  // quiet warnings
    (void)objects_info;  // quiet warnings
    // Enum requires extension XR_ML_facial_expression, so check that it is enabled
    if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_ML_facial_expression")) {
        std::string vuid = "VUID-";
        vuid += validation_name;
        vuid += "-";
        vuid += item_name;
        vuid += "-parameter";
        std::string error_str = "XrFacialBlendShapeML requires extension ";
        error_str += " \"XR_ML_facial_expression\" to be enabled, but it is not enabled";
        CoreValidLogMessage(instance_info, vuid,
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, error_str);
        return false;
    }
    switch (value) {
        case XR_FACIAL_BLEND_SHAPE_BROW_LOWERER_L_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_BROW_LOWERER_R_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_CHEEK_RAISER_L_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_CHEEK_RAISER_R_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_CHIN_RAISER_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_DIMPLER_L_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_DIMPLER_R_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_EYES_CLOSED_L_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_EYES_CLOSED_R_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_INNER_BROW_RAISER_L_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_INNER_BROW_RAISER_R_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_JAW_DROP_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_LID_TIGHTENER_L_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_LID_TIGHTENER_R_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_LIP_CORNER_DEPRESSOR_L_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_LIP_CORNER_DEPRESSOR_R_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_LIP_CORNER_PULLER_L_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_LIP_CORNER_PULLER_R_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_LIP_FUNNELER_LB_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_LIP_FUNNELER_LT_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_LIP_FUNNELER_RB_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_LIP_FUNNELER_RT_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_LIP_PRESSOR_L_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_LIP_PRESSOR_R_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_LIP_PUCKER_L_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_LIP_PUCKER_R_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_LIP_STRETCHER_L_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_LIP_STRETCHER_R_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_LIP_SUCK_LB_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_LIP_SUCK_LT_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_LIP_SUCK_RB_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_LIP_SUCK_RT_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_LIP_TIGHTENER_L_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_LIP_TIGHTENER_R_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_LIPS_TOWARD_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_LOWER_LIP_DEPRESSOR_L_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_LOWER_LIP_DEPRESSOR_R_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_NOSE_WRINKLER_L_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_NOSE_WRINKLER_R_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_OUTER_BROW_RAISER_L_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_OUTER_BROW_RAISER_R_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_UPPER_LID_RAISER_L_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_UPPER_LID_RAISER_R_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_UPPER_LIP_RAISER_L_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_UPPER_LIP_RAISER_R_ML:
            return true;
        case XR_FACIAL_BLEND_SHAPE_TONGUE_OUT_ML:
            return true;
    default:
        return false;
}
}